

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization_visitor.cpp
# Opt level: O3

void __thiscall optimization_visitor::visit(optimization_visitor *this,LastExpression *ptr)

{
  pointer *pppEVar1;
  Expressions *pEVar2;
  iterator __position;
  Expr **__args;
  
  pEVar2 = this->exprs;
  __args = &ptr->expr;
  __position._M_current =
       (pEVar2->exprs).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pEVar2->exprs).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Expr*,std::allocator<Expr*>>::_M_realloc_insert<Expr*const&>
              ((vector<Expr*,std::allocator<Expr*>> *)&pEVar2->exprs,__position,__args);
  }
  else {
    *__position._M_current = *__args;
    pppEVar1 = &(pEVar2->exprs).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  (**((*__args)->super_Base)._vptr_Base)(*__args,this);
  return;
}

Assistant:

void optimization_visitor::visit(LastExpression* ptr) {
    exprs->exprs.push_back(ptr->expr);
    ptr->expr->accept(this);
}